

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O3

string * __thiscall
Catch::StringMaker<signed_char,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<signed_char,void> *this,char value)

{
  undefined8 in_RAX;
  size_t sVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  char *__s;
  char chstr [4];
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  switch((int)this) {
  case 9:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __s = "\'\\t\'";
    pcVar2 = "";
    break;
  case 10:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __s = "\'\\n\'";
    pcVar2 = "";
    break;
  default:
    if ((byte)this < 0x20) {
      StringMaker<unsigned_long_long,void>::convert_abi_cxx11_
                (__return_storage_ptr__,(StringMaker<unsigned_long_long,void> *)(long)(int)this,
                 CONCAT71(in_register_00000011,value));
      return __return_storage_ptr__;
    }
    __s = (char *)((long)&uStack_18 + 4);
    uStack_18 = CONCAT44(0x272027,(int)in_RAX);
    uStack_18 = CONCAT26(0x27,CONCAT15((byte)this,(undefined5)uStack_18));
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar1 = strlen(__s);
    pcVar2 = (char *)((long)&uStack_18 + sVar1 + 4);
    break;
  case 0xc:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __s = "\'\\f\'";
    pcVar2 = "";
    break;
  case 0xd:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __s = "\'\\r\'";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<signed char>::convert(signed char value) {
    if (value == '\r') {
        return "'\\r'";
    } else if (value == '\f') {
        return "'\\f'";
    } else if (value == '\n') {
        return "'\\n'";
    } else if (value == '\t') {
        return "'\\t'";
    } else if ('\0' <= value && value < ' ') {
        return ::Catch::Detail::stringify(static_cast<unsigned int>(value));
    } else {
        char chstr[] = "' '";
        chstr[1] = value;
        return chstr;
    }
}